

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

void __thiscall
Js::JavascriptLibrary::AddAccessorsToLibraryObject
          (JavascriptLibrary *this,DynamicObject *object,PropertyId propertyId,
          RecyclableObject *getterFunction,RecyclableObject *setterFunction)

{
  RecyclableObject *pRVar1;
  
  pRVar1 = (this->super_JavascriptLibraryBase).undefinedValue.ptr;
  if (getterFunction == (RecyclableObject *)0x0) {
    getterFunction = pRVar1;
  }
  if (setterFunction != (RecyclableObject *)0x0) {
    pRVar1 = setterFunction;
  }
  (*(object->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x2d])(object,(ulong)(uint)propertyId,getterFunction,pRVar1,0);
  (*(object->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x3e])(object,(ulong)(uint)propertyId,6);
  return;
}

Assistant:

void JavascriptLibrary::AddAccessorsToLibraryObject(DynamicObject* object, PropertyId propertyId, RecyclableObject* getterFunction, RecyclableObject* setterFunction)
    {
        if (getterFunction == nullptr)
        {
            getterFunction = GetUndefined();
        }

        if (setterFunction == nullptr)
        {
            setterFunction = GetUndefined();
        }

        object->SetAccessors(propertyId, getterFunction, setterFunction);
        object->SetAttributes(propertyId, PropertyConfigurable | PropertyWritable);
    }